

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# student_t_dist.hpp
# Opt level: O3

result_type_conflict1 __thiscall
trng::student_t_dist<float>::pdf(student_t_dist<float> *this,result_type_conflict1 x)

{
  int iVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  
  fVar2 = lgammaf((float)((this->P).nu_ + 1) * 0.5);
  fVar3 = lgammaf((float)(this->P).nu_ * 0.5);
  fVar2 = expf(fVar2 - fVar3);
  fVar3 = (float)(this->P).nu_ * 3.1415927;
  if (fVar3 < 0.0) {
    fVar3 = sqrtf(fVar3);
  }
  else {
    fVar3 = SQRT(fVar3);
  }
  iVar1 = (this->P).nu_;
  fVar4 = powf((x * x) / (float)iVar1 + 1.0,(float)(iVar1 + 1) * -0.5);
  return fVar4 * (fVar2 / fVar3);
}

Assistant:

pdf(result_type x) const {
      const result_type norm{math::exp(math::ln_Gamma((P.nu() + 1) / result_type(2)) -
                                       math::ln_Gamma(P.nu() / result_type(2))) /
                             math::sqrt(math::constants<result_type>::pi * P.nu())};
      return norm * math::pow(1 + x * x / P.nu(), (P.nu() + 1) / result_type(-2));
    }